

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanup
          (ThreadSafeArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  CleanupNode *pCVar1;
  ArenaBlock *pAVar2;
  bool bVar3;
  char *pcVar4;
  char **ppcVar5;
  char **v2;
  LogMessage *pLVar6;
  ArenaBlock *pAVar7;
  SerialArena *local_270;
  SerialArena *arena;
  _func_void_void_ptr *destructor_local;
  size_t align_local;
  size_t n_local;
  ThreadSafeArena *this_local;
  LogMessage local_230;
  Voidify local_219;
  char *local_218;
  Nullable<const_char_*> local_210;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  char *next;
  ThreadSafeArena *local_1f8;
  char *ret;
  _func_void_void_ptr *local_1e8;
  ulong local_1e0;
  SerialArena *local_1d8;
  ThreadSafeArena *local_1d0;
  char *local_1c8;
  ThreadSafeArena *local_1c0;
  SerialArena *local_1b8;
  byte local_199;
  LogMessage local_198;
  Voidify local_181;
  Nullable<const_char_*> local_180;
  SerialArena *local_178;
  char *local_170 [2];
  char *end_1;
  byte local_149;
  LogMessage local_148;
  Voidify local_131;
  char *local_130;
  char *local_128;
  Nullable<const_char_*> local_120;
  long local_118;
  char *local_110;
  size_t local_100;
  SerialArena *local_f8;
  char *local_f0;
  ThreadSafeArena *local_e8;
  ChunkList *local_e0;
  ThreadSafeArena *local_d8;
  char *local_d0;
  char *local_c8;
  ThreadSafeArena *local_c0;
  ChunkList *local_b8;
  byte local_99;
  LogMessage local_98;
  Voidify local_81;
  SerialArena *local_80;
  char *local_78;
  CleanupNode *local_70;
  char *end;
  byte local_51;
  LogMessage local_50;
  Voidify local_39;
  CleanupNode *local_38;
  CleanupNode *local_30;
  CleanupNode *local_28;
  long local_20;
  CleanupNode *local_18;
  CleanupNode *local_10;
  
  arena = (SerialArena *)destructor;
  destructor_local = (_func_void_void_ptr *)align;
  align_local = n;
  n_local = (size_t)this;
  bVar3 = GetSerialArenaFast(this,&local_270);
  if (bVar3) {
    local_1d8 = local_270;
    local_1e8 = destructor_local;
    ret = (char *)arena;
    local_100 = align_local;
    local_1e0 = align_local + 7 & 0xfffffffffffffff8;
    next = (char *)ArenaAlignAs((size_t)destructor_local);
    pcVar4 = SerialArena::ptr(local_270);
    local_1f8 = (ThreadSafeArena *)ArenaAlign::CeilDefaultAligned<char>((ArenaAlign *)&next,pcVar4);
    if (local_270->limit_ < (char *)((long)&local_1f8->tag_and_id_ + local_1e0)) {
      local_1d0 = (ThreadSafeArena *)
                  SerialArena::AllocateAlignedWithCleanupFallback
                            (local_270,local_1e0,(size_t)local_1e8,(_func_void_void_ptr *)ret);
    }
    else {
      UnpoisonMemoryRegion(local_1f8,local_1e0);
      absl_log_internal_check_op_result =
           (Nullable<const_char_*>)((long)&local_1f8->tag_and_id_ + local_1e0);
      SerialArena::set_ptr(local_270,absl_log_internal_check_op_result);
      local_1b8 = local_270;
      local_1c0 = local_1f8;
      local_1c8 = ret;
      local_e0 = &local_270->cleanup_list_;
      local_e8 = local_1f8;
      local_f0 = ret;
      local_f8 = local_270;
      if ((local_270->cleanup_list_).next_ < (local_270->cleanup_list_).limit_) {
        local_c0 = local_1f8;
        local_c8 = ret;
        local_d8 = local_1f8;
        local_d0 = ret;
        pCVar1 = (local_270->cleanup_list_).next_;
        (local_270->cleanup_list_).next_ = pCVar1 + 1;
        pCVar1->elem = local_1f8;
        pCVar1->destructor = (_func_void_void_ptr *)ret;
        local_b8 = local_e0;
      }
      else {
        cleanup::ChunkList::AddFallback(local_e0,local_1f8,(_func_void_void_ptr *)ret,local_270);
      }
      local_80 = local_270;
      local_99 = 0;
      bVar3 = true;
      if ((local_270->cleanup_list_).prefetch_ptr_ != (char *)0x0) {
        bVar3 = (local_270->cleanup_list_).head_ <=
                (Chunk *)(local_270->cleanup_list_).prefetch_ptr_;
      }
      if (!bVar3) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                   ,0x136,
                   "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
                  );
        local_99 = 1;
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar6);
      }
      if ((local_99 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_98);
      }
      local_28 = (local_270->cleanup_list_).next_;
      local_30 = (local_270->cleanup_list_).limit_;
      local_38 = (CleanupNode *)(local_270->cleanup_list_).prefetch_ptr_;
      local_20 = 0x180;
      if (((long)local_38 - (long)local_28 < 0x181) && (local_38 < local_30)) {
        ppcVar5 = std::max<char_const*>((char **)&local_28,(char **)&local_38);
        local_38 = (CleanupNode *)*ppcVar5;
        local_51 = 0;
        if (local_38 == (CleanupNode *)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_50,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                     ,0x122,"prefetch_ptr != nullptr");
          local_51 = 1;
          pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar6);
        }
        if ((local_51 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_50);
        }
        local_78 = (char *)((long)&local_38->elem + local_20);
        ppcVar5 = std::min<char_const*>((char **)&local_30,&local_78);
        local_70 = (CleanupNode *)*ppcVar5;
        for (; local_38 < local_70; local_38 = local_38 + 4) {
          local_10 = local_38;
        }
      }
      (local_270->cleanup_list_).prefetch_ptr_ = (char *)local_38;
      local_18 = local_38;
      ppcVar5 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>(&local_270->limit_);
      local_218 = SerialArena::ptr(local_270);
      v2 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>(&local_218);
      local_210 = absl::lts_20250127::log_internal::Check_GEImpl<char*,char*>
                            (ppcVar5,v2,"limit_ >= ptr()");
      if (local_210 != (Nullable<const_char_*>)0x0) {
        pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_210);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_230,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                   ,0xf2,pcVar4);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_230);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_219,pLVar6);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_230);
      }
      local_178 = local_270;
      local_180 = absl_log_internal_check_op_result;
      local_199 = 0;
      bVar3 = true;
      if (local_270->prefetch_ptr_ != (char *)0x0) {
        pAVar2 = (ArenaBlock *)local_270->prefetch_ptr_;
        pAVar7 = SerialArena::head(local_270);
        bVar3 = pAVar7 <= pAVar2;
      }
      if (!bVar3) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_198,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                   ,0x12d,
                   "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
                  );
        local_199 = 1;
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_198);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_181,pLVar6);
      }
      if ((local_199 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_198);
      }
      local_128 = local_270->limit_;
      local_130 = local_270->prefetch_ptr_;
      local_118 = 0x400;
      local_120 = local_180;
      local_110 = local_130;
      if ((long)local_130 - (long)local_180 < 0x401) {
        if (local_130 < local_128) {
          ppcVar5 = std::max<char_const*>(&local_120,&local_130);
          local_130 = *ppcVar5;
          local_149 = 0;
          if (local_130 == (char *)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_148,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                       ,0x122,"prefetch_ptr != nullptr");
            local_149 = 1;
            pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_148);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_131,pLVar6);
          }
          if ((local_149 & 1) != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_148);
          }
          local_170[0] = local_130 + local_118;
          ppcVar5 = std::min<char_const*>(&local_128,local_170);
          for (; local_130 < *ppcVar5; local_130 = local_130 + 0x40) {
          }
        }
        local_110 = local_130;
      }
      local_270->prefetch_ptr_ = local_110;
      local_1d0 = local_1f8;
    }
    this_local = local_1d0;
  }
  else {
    this_local = (ThreadSafeArena *)
                 AllocateAlignedWithCleanupFallback
                           (this,align_local,(size_t)destructor_local,(_func_void_void_ptr *)arena);
  }
  return this_local;
}

Assistant:

void* ThreadSafeArena::AllocateAlignedWithCleanup(size_t n, size_t align,
                                                  void (*destructor)(void*)) {
  SerialArena* arena;
  if (ABSL_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
    return arena->AllocateAlignedWithCleanup(n, align, destructor);
  } else {
    return AllocateAlignedWithCleanupFallback(n, align, destructor);
  }
}